

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void FastestHash_test(void *key,int len,uint32_t seed,void *out)

{
  uint64_t uVar1;
  uint64_t *in_RCX;
  void *in_stack_00000018;
  
  uVar1 = FastestHash(in_stack_00000018,(size_t)key,CONCAT44(len,seed));
  *in_RCX = uVar1;
  return;
}

Assistant:

inline void FastestHash_test (const void * key, int len, uint32_t seed, void * out) {
  *(uint64_t*)out = FastestHash(key, (size_t)len, (uint64_t)seed);
}